

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O1

People * __thiscall tcmalloc::FixedAllocator<People>::Alloc(FixedAllocator<People> *this)

{
  char *pcVar1;
  void *result;
  People *pPVar2;
  
  if (this->inited == false) {
    if (this->construct == false) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                    ,0x18,"T *tcmalloc::FixedAllocator<People>::Alloc() [T = People]");
    }
    this->area_ = (char *)0x0;
    this->area_free_ = 0;
    this->freelist_ = (void *)0x0;
    this->inited = true;
  }
  pPVar2 = (People *)this->freelist_;
  if (pPVar2 == (People *)0x0) {
    if (this->area_free_ < 8) {
      pcVar1 = (char *)mmap((void *)0x0,0x8000000,3,0x22,-1,0);
      if (pcVar1 == (char *)0xffffffffffffffff) {
        return (People *)0x0;
      }
      this->area_ = pcVar1;
      this->area_free_ = 0x8000000;
    }
    pPVar2 = (People *)this->area_;
    this->area_ = (char *)(pPVar2 + 1);
    this->area_free_ = this->area_free_ - 8;
  }
  else {
    this->freelist_ = (void *)*pPVar2;
  }
  return pPVar2;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }